

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall
discordpp::ChannelMention::ChannelMention(ChannelMention *this,ChannelMention *param_1)

{
  _Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var3;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var4;
  _Head_base<0UL,_int_*,_false> _Var5;
  
  _Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (param_1->id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>;
  if (_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl == (Snowflake *)0x0) {
    _Var3._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var3._M_head_impl = (Snowflake *)operator_new(8);
    (_Var3._M_head_impl)->_value =
         *(uint64_t *)_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  }
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)_Var3._M_head_impl;
  (this->id).s_ = (param_1->id).s_;
  _Var3._M_head_impl =
       (param_1->guild_id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (Snowflake *)0x0) {
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var3._M_head_impl)->_value;
  }
  (this->guild_id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->guild_id).s_ = (param_1->guild_id).s_;
  _Var2._M_head_impl =
       (param_1->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var2._M_head_impl == (int *)0x0) {
    _Var5._M_head_impl = (int *)0x0;
  }
  else {
    _Var5._M_head_impl = (int *)operator_new(4);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->type).s_ = (param_1->type).s_;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,&param_1->name);
  return;
}

Assistant:

ChannelMention(
        field<Snowflake> id = uninitialized,
        field<Snowflake> guild_id = uninitialized,
        field<int> type = uninitialized,
        field<std::string> name = uninitialized
    ):
        id(id),
        guild_id(guild_id),
        type(type),
        name(name)
    {}